

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.h
# Opt level: O3

Expression __thiscall dynet::RNNBuilder::add_input(RNNBuilder *this,RNNPointer *prev,Expression *x)

{
  iterator __position;
  undefined8 extraout_RDX;
  RNNPointer *pRVar1;
  Expression EVar2;
  
  RNNStateMachine::transition((RNNStateMachine *)(prev + 4),add_input);
  __position._M_current = *(RNNPointer **)(prev + 8);
  if (__position._M_current == *(RNNPointer **)(prev + 10)) {
    std::vector<dynet::RNNPointer,std::allocator<dynet::RNNPointer>>::
    _M_realloc_insert<dynet::RNNPointer_const&>
              ((vector<dynet::RNNPointer,std::allocator<dynet::RNNPointer>> *)(prev + 6),__position,
               (RNNPointer *)x);
    pRVar1 = *(RNNPointer **)(prev + 8);
  }
  else {
    (__position._M_current)->t = *(int *)&x->pg;
    pRVar1 = __position._M_current + 1;
    *(RNNPointer **)(prev + 8) = pRVar1;
  }
  prev[2].t = (int)((ulong)((long)pRVar1 - *(long *)(prev + 6)) >> 2) + -1;
  (**(code **)(*(long *)prev + 0x68))(this,prev,*(undefined4 *)&x->pg);
  EVar2._8_8_ = extraout_RDX;
  EVar2.pg = (ComputationGraph *)this;
  return EVar2;
}

Assistant:

Expression add_input(const RNNPointer& prev, const Expression& x) {
    sm.transition(RNNOp::add_input);
    head.push_back(prev);
    cur = head.size() - 1;
    return add_input_impl(prev, x);
  }